

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O0

void __thiscall cmTarget::GetTllSignatureTraces(cmTarget *this,ostream *s,TLLSignature sig)

{
  bool bVar1;
  char *pcVar2;
  ostream *poVar3;
  pointer pcVar4;
  cmState *this_00;
  string *top;
  string local_d8;
  undefined1 local_b8 [8];
  cmListFileContext lfc;
  pair<cmTarget::TLLSignature,_cmListFileContext> *cmd;
  iterator __end1;
  iterator __begin1;
  vector<std::pair<cmTarget::TLLSignature,_cmListFileContext>,_std::allocator<std::pair<cmTarget::TLLSignature,_cmListFileContext>_>_>
  *__range1;
  char *sigString;
  TLLSignature sig_local;
  ostream *s_local;
  cmTarget *this_local;
  
  pcVar2 = "plain";
  if (sig == KeywordTLLSignature) {
    pcVar2 = "keyword";
  }
  poVar3 = std::operator<<(s,"The uses of the ");
  poVar3 = std::operator<<(poVar3,pcVar2);
  std::operator<<(poVar3," signature are here:\n");
  pcVar4 = std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::operator->
                     (&this->impl);
  __end1 = std::
           vector<std::pair<cmTarget::TLLSignature,_cmListFileContext>,_std::allocator<std::pair<cmTarget::TLLSignature,_cmListFileContext>_>_>
           ::begin(&pcVar4->TLLCommands);
  cmd = (pair<cmTarget::TLLSignature,_cmListFileContext> *)
        std::
        vector<std::pair<cmTarget::TLLSignature,_cmListFileContext>,_std::allocator<std::pair<cmTarget::TLLSignature,_cmListFileContext>_>_>
        ::end(&pcVar4->TLLCommands);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<std::pair<cmTarget::TLLSignature,_cmListFileContext>_*,_std::vector<std::pair<cmTarget::TLLSignature,_cmListFileContext>,_std::allocator<std::pair<cmTarget::TLLSignature,_cmListFileContext>_>_>_>
                                *)&cmd);
    if (!bVar1) break;
    lfc.DeferId.
    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ._32_8_ = __gnu_cxx::
              __normal_iterator<std::pair<cmTarget::TLLSignature,_cmListFileContext>_*,_std::vector<std::pair<cmTarget::TLLSignature,_cmListFileContext>,_std::allocator<std::pair<cmTarget::TLLSignature,_cmListFileContext>_>_>_>
              ::operator*(&__end1);
    if (((reference)
        lfc.DeferId.
        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
        ._M_payload.
        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ._32_8_)->first == sig) {
      cmListFileContext::cmListFileContext
                ((cmListFileContext *)local_b8,
                 &((reference)
                  lfc.DeferId.
                  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                  ._M_payload.
                  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                  .
                  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ._32_8_)->second);
      pcVar4 = std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::
               operator->(&this->impl);
      this_00 = cmMakefile::GetState(pcVar4->Makefile);
      top = cmState::GetSourceDirectory_abi_cxx11_(this_00);
      cmSystemTools::RelativeIfUnder(&local_d8,top,(string *)((long)&lfc.Name.field_2 + 8));
      std::__cxx11::string::operator=
                ((string *)(lfc.Name.field_2._M_local_buf + 8),(string *)&local_d8);
      std::__cxx11::string::~string((string *)&local_d8);
      poVar3 = std::operator<<(s," * ");
      poVar3 = ::operator<<(poVar3,(cmListFileContext *)local_b8);
      std::operator<<(poVar3,'\n');
      cmListFileContext::~cmListFileContext((cmListFileContext *)local_b8);
    }
    __gnu_cxx::
    __normal_iterator<std::pair<cmTarget::TLLSignature,_cmListFileContext>_*,_std::vector<std::pair<cmTarget::TLLSignature,_cmListFileContext>,_std::allocator<std::pair<cmTarget::TLLSignature,_cmListFileContext>_>_>_>
    ::operator++(&__end1);
  }
  return;
}

Assistant:

void cmTarget::GetTllSignatureTraces(std::ostream& s, TLLSignature sig) const
{
  const char* sigString =
    (sig == cmTarget::KeywordTLLSignature ? "keyword" : "plain");
  s << "The uses of the " << sigString << " signature are here:\n";
  for (auto const& cmd : this->impl->TLLCommands) {
    if (cmd.first == sig) {
      cmListFileContext lfc = cmd.second;
      lfc.FilePath = cmSystemTools::RelativeIfUnder(
        this->impl->Makefile->GetState()->GetSourceDirectory(), lfc.FilePath);
      s << " * " << lfc << '\n';
    }
  }
}